

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void __thiscall
wallet::wallet_tests::scan_for_wallet_transactions::test_method(scan_for_wallet_transactions *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  CKey *this_00;
  pointer ppCVar1;
  ChainstateManager *pCVar2;
  Chain *pCVar3;
  MockableData records;
  MockableData records_00;
  MockableData records_01;
  MockableData records_02;
  bool bVar4;
  Chainstate *pCVar5;
  FlatFilePos FVar6;
  CBlockFileInfo *pCVar7;
  element_type *peVar8;
  WalletDatabase *pWVar9;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar10;
  iterator pvVar11;
  WalletRescanReserver *pWVar12;
  ScanResult *pSVar13;
  iterator pvVar14;
  uint256 *puVar15;
  optional<int> *poVar16;
  pointer *ppuVar17;
  uint256 *puVar18;
  CBlockIndex *pCVar19;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  initializer_list<int> __l;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  initializer_list<int> __l_00;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  undefined4 in_stack_fffffffffffff348;
  undefined4 uVar20;
  undefined4 in_stack_fffffffffffff34c;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 in_stack_fffffffffffff350;
  undefined4 in_stack_fffffffffffff354;
  CBlockLocator *pCVar23;
  long **pplVar24;
  assertion_result *ar;
  undefined8 in_stack_fffffffffffff358;
  char *pcVar25;
  undefined8 in_stack_fffffffffffff360;
  CBlockIndex *this_01;
  CBlockIndex *this_02;
  char *local_c68;
  char *local_c60;
  undefined1 *local_c58;
  undefined1 *local_c50;
  char *local_c48;
  char *local_c40;
  char *local_c38;
  char *local_c30;
  undefined1 *local_c28;
  undefined1 *local_c20;
  char *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  char *local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  undefined1 *local_bc8;
  undefined1 *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  char *local_b88;
  char *local_b80;
  long *local_b78;
  char *local_b70;
  char *local_b68;
  undefined1 *local_b60;
  undefined1 *local_b58;
  char *local_b50;
  char *local_b48;
  char *local_b40;
  char *local_b38;
  undefined1 *local_b30;
  undefined1 *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  char *local_b08;
  undefined1 *local_b00;
  undefined1 *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  undefined1 *local_ad0;
  undefined1 *local_ac8;
  char *local_ac0;
  char *local_ab8;
  char *local_ab0;
  char *local_aa8;
  undefined1 *local_aa0;
  undefined1 *local_a98;
  char *local_a90;
  char *local_a88;
  long *local_a80;
  char *local_a78;
  char *local_a70;
  undefined1 *local_a68;
  undefined1 *local_a60;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  assertion_result local_a28;
  undefined1 *local_a10;
  undefined1 *local_a08;
  char *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  undefined1 *local_9b0;
  undefined1 *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  undefined1 *local_980;
  undefined1 *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  undefined1 *local_950;
  undefined1 *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  char *local_928;
  undefined1 *local_920;
  undefined1 *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  undefined1 *local_8f0;
  undefined1 *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  WalletBatch local_8c0;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  _Any_data local_890;
  code *local_880;
  code *local_878;
  time_point fake_time;
  long *local_868;
  char *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  long *local_770;
  WalletRescanReserver reserver;
  uint256 local_738;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_718;
  uint256 local_6e8;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_6c8;
  uint256 local_698;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_678;
  CBlockLocator locator;
  CBlockLocator locator_1;
  ScanResult result;
  uint256 local_5a8;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_588;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  AnnotatedMixin<std::recursive_mutex> local_368 [17];
  CBlock local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x4e,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x4e,"operator()","m_node.chainman");
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock13,&cs_main,
             "inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp\", 78, __func__, \"m_node.chainman\")->GetMutex()"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x4e,false);
  pCVar5 = ChainstateManager::ActiveChainstate
                     ((this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                      super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar1 = (pCVar5->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (pCVar5->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar19 = (CBlockIndex *)0x0;
  }
  else {
    pCVar19 = ppCVar1[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock13,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x4f,false);
  pCVar2 = (val->_M_t).
           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
           super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  FVar6 = CBlockIndex::GetBlockPos(pCVar19);
  pCVar7 = ::node::BlockManager::GetBlockFileInfo(&pCVar2->m_blockman,(long)FVar6.nFile);
  pCVar7->nSize = 0x8000000;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  reserver.m_wallet = (CWallet *)0x0;
  reserver.m_could_reserve = false;
  reserver._9_7_ = 0;
  reserver.m_now.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  this_00 = &(this->super_TestChain100Setup).coinbaseKey;
  CKey::GetPubKey((CPubKey *)&criticalblock13,this_00);
  GetScriptForRawPubKey((CScript *)&result,(CPubKey *)&criticalblock13);
  TestChain100Setup::CreateAndProcessBlock
            (&local_a8,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&reserver,
             (CScript *)&result,(Chainstate *)0x0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_a8.vtx);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&result);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&reserver);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x51,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x51,"operator()","m_node.chainman");
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock13,&cs_main,
             "inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp\", 81, __func__, \"m_node.chainman\")->GetMutex()"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x51,false);
  pCVar5 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar1 = (pCVar5->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (pCVar5->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this_01 = (CBlockIndex *)0x0;
  }
  else {
    this_01 = ppCVar1[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  pCVar3 = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"",(allocator<char> *)&reserver);
  local_588._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_588._M_impl.super__Rb_tree_header._M_header;
  local_588._M_impl._0_8_ = 0;
  local_588._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_588._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_588._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_588._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl._4_4_ = in_stack_fffffffffffff34c;
  records._M_t._M_impl._0_4_ = in_stack_fffffffffffff348;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_color = in_stack_fffffffffffff350;
  records._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = in_stack_fffffffffffff354;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffff358;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffff360;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)this_01;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pCVar19;
  local_588._M_impl.super__Rb_tree_header._M_header._M_right =
       local_588._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase(records);
  CWallet::CWallet((CWallet *)&criticalblock13,pCVar3,(string *)&result,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_770);
  if (local_770 != (long *)0x0) {
    (**(code **)(*local_770 + 8))();
  }
  local_770 = (long *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_588);
  std::__cxx11::string::~string((string *)&result);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&result,local_368,
             "wallet.cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x57,false);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x58,"test_method","m_node.chainman");
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&reserver,&cs_main,
             "Assert(m_node.chainman)->GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x58,false);
  CWallet::SetWalletFlag((CWallet *)&criticalblock13,0x400000000);
  ChainstateManager::ActiveChainstate
            ((val->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar5 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CBlockIndex::GetBlockHash
            (&local_5a8,
             (pCVar5->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&reserver);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&result)
  ;
  AddKey((CWallet *)&criticalblock13,this_00);
  pWVar12 = &reserver;
  reserver._8_8_ = reserver._8_8_ & 0xffffffffffffff00;
  reserver.m_now.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  reserver.m_now.super__Function_base._M_functor._8_8_ = 0;
  reserver.m_now.super__Function_base._M_manager = (_Manager_type)0x0;
  reserver.m_now._M_invoker = (_Invoker_type)0x0;
  reserver.m_wallet = (CWallet *)&criticalblock13;
  WalletRescanReserver::reserve(pWVar12,false);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar11 = (iterator)0x0;
  CWallet::ScanForWalletTransactions
            (&result,(CWallet *)&criticalblock13,(uint256 *)&locator,0,(optional<int>)0x0,pWVar12,
             false,false);
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = (iterator)pWVar12;
  msg.m_begin = pvVar11;
  file.m_end = (iterator)0x60;
  file.m_begin = (iterator)&local_780;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_790,msg);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_798 = "";
  pCVar23 = &locator_1;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar11 = (iterator)0x2;
  pSVar13 = &result;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::CWallet::ScanResult::_unnamed_type_1_,_unnamed_type_1_>
            (&locator,&local_7a0,0x60,1,2,pSVar13,0xc83506,(int)pCVar23,
             "CWallet::ScanResult::FAILURE");
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pSVar13;
  msg_00.m_begin = pvVar11;
  file_00.m_end = (iterator)0x61;
  file_00.m_begin = (iterator)&local_7b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_7c0,
             msg_00);
  bVar4 = base_blob<256U>::IsNull(&result.last_failed_block.super_base_blob<256U>);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pplVar24 = (long **)&local_a28;
  local_a28._0_8_ = "result.last_failed_block.IsNull()";
  local_a28.m_message.px = (element_type *)0xc83552;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_7c8 = "";
  pvVar11 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,(check_type)pCVar23,
             (size_t)&local_7d0,0x61);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar14;
  msg_01.m_begin = pvVar11;
  file_01.m_end = (iterator)0x62;
  file_01.m_begin = (iterator)&local_7e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_7f0,
             msg_01);
  bVar4 = base_blob<256U>::IsNull(&result.last_scanned_block.super_base_blob<256U>);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a28._0_8_ = "result.last_scanned_block.IsNull()";
  local_a28.m_message.px = (element_type *)0xc83575;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_7f8 = "";
  pvVar11 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,(check_type)pCVar23,
             (size_t)&local_800,0x62);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar14;
  msg_02.m_begin = pvVar11;
  file_02.m_end = (iterator)0x63;
  file_02.m_begin = (iterator)&local_810;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_820,
             msg_02);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(CONCAT71(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start._1_7_,
                          result.last_scanned_height.super__Optional_base<int,_true,_true>.
                          _M_payload.super__Optional_payload_base<int>._M_engaged) ^ 1);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a28._0_8_ = "!result.last_scanned_height";
  local_a28.m_message.px = (element_type *)0xc83591;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_830 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_828 = "";
  pvVar11 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,(check_type)pCVar23,
             (size_t)&local_830,99);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_838 = "";
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar14;
  msg_03.m_begin = pvVar11;
  file_03.m_end = (iterator)0x64;
  file_03.m_begin = (iterator)&local_840;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_850,
             msg_03);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_858 = "";
  GetBalance((Balance *)&locator,(CWallet *)&criticalblock13,0,true);
  local_a28._0_8_ = local_a28._0_8_ & 0xffffffff00000000;
  pcVar25 = "0";
  uVar20 = 0xc83592;
  uVar21 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&locator_1,&local_860,100,1,2);
  WalletRescanReserver::~WalletRescanReserver(&reserver);
  CWallet::~CWallet((CWallet *)&criticalblock13);
  pCVar3 = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"",(allocator<char> *)&reserver);
  local_678._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_678._M_impl.super__Rb_tree_header._M_header;
  local_678._M_impl._0_8_ = 0;
  local_678._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_678._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_678._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_678._M_impl.super__Rb_tree_header._M_node_count = 0;
  records_00._M_t._M_impl._4_4_ = uVar21;
  records_00._M_t._M_impl._0_4_ = uVar20;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (int)pplVar24;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = (int)((ulong)pplVar24 >> 0x20);
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pcVar25;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffff360;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)this_01;
  records_00._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pCVar19;
  local_678._M_impl.super__Rb_tree_header._M_header._M_right =
       local_678._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase(records_00);
  CWallet::CWallet((CWallet *)&criticalblock13,pCVar3,(string *)&result,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_868);
  if (local_868 != (long *)0x0) {
    (**(code **)(*local_868 + 8))();
  }
  local_868 = (long *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_678);
  std::__cxx11::string::~string((string *)&result);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&result,local_368,
             "wallet.cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x6c,false);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x6d,"test_method","m_node.chainman");
  pvVar11 = (iterator)0x6d;
  pvVar14 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&reserver,&cs_main,
             "Assert(m_node.chainman)->GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x6d,false);
  CWallet::SetWalletFlag((CWallet *)&criticalblock13,0x400000000);
  ChainstateManager::ActiveChainstate
            ((val->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar5 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CBlockIndex::GetBlockHash
            (&local_698,
             (pCVar5->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&reserver);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&result)
  ;
  AddKey((CWallet *)&criticalblock13,this_00);
  reserver._8_8_ = reserver._8_8_ & 0xffffffffffffff00;
  reserver.m_now.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  reserver.m_now.super__Function_base._M_functor._8_8_ = 0;
  reserver.m_now.super__Function_base._M_manager = (_Manager_type)0x0;
  reserver.m_now._M_invoker = (_Invoker_type)0x0;
  local_890._M_unused._M_object = &fake_time;
  fake_time.__d.__r = (duration)0;
  local_890._8_8_ = 0;
  local_878 = std::
              _Function_handler<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:116:25)>
              ::_M_invoke;
  local_880 = std::
              _Function_handler<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:116:25)>
              ::_M_manager;
  reserver.m_wallet = (CWallet *)&criticalblock13;
  std::
  function<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_()>
  ::operator=(&reserver.m_now,
              (function<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_()>
               *)&local_890);
  std::_Function_base::~_Function_base((_Function_base *)&local_890);
  WalletRescanReserver::reserve(&reserver,false);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_898 = "";
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar14;
  msg_04.m_begin = pvVar11;
  file_04.m_end = (iterator)0x79;
  file_04.m_begin = (iterator)&local_8a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_8b0,
             msg_04);
  peVar8 = (element_type *)CWallet::GetDatabase((CWallet *)&criticalblock13);
  (*(peVar8->m_stream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[0xe])
            (&local_a28,peVar8,1);
  local_a28.m_message.px = peVar8;
  bVar4 = WalletBatch::ReadBestBlock((WalletBatch *)&local_a28,&locator);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,!bVar4);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._20_8_ = &local_8c0;
  local_8c0.m_batch._M_t.
  super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t.
  super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
  super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl =
       (__uniq_ptr_data<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>,_true,_true>
        )(__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)
         0xc835b5;
  local_8c0.m_database = (WalletDatabase *)0xc835ee;
  result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  result._0_8_ = &PTR__lazy_ostream_0113a070;
  result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_8d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_8c8 = "";
  pvVar11 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&locator_1,(lazy_ostream *)&result,1,0,WARN,(check_type)pplVar24,
             (size_t)&local_8d0,0x79);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((DatabaseBatch *)local_a28._0_8_ != (DatabaseBatch *)0x0) {
    (*(*(_func_int ***)local_a28._0_8_)[5])();
  }
  local_8e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_8d8 = "";
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar14;
  msg_05.m_begin = pvVar11;
  file_05.m_end = (iterator)0x7a;
  file_05.m_begin = (iterator)&local_8e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_8f0,
             msg_05);
  ar = (assertion_result *)&locator_1;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                         .super__Vector_impl_data._M_start ==
                         locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                         .super__Vector_impl_data._M_finish);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a28._0_8_ = "locator.IsNull()";
  local_a28.m_message.px = (element_type *)0xc83668;
  result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  result._0_8_ = &PTR__lazy_ostream_0113a070;
  result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_900 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_8f8 = "";
  result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._20_8_ = (WalletBatch *)&local_a28
  ;
  boost::test_tools::tt_detail::report_assertion
            (ar,(lazy_ostream *)&result,1,0,WARN,(check_type)pplVar24,(size_t)&local_900,0x7a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            ((_Vector_base<uint256,_std::allocator<uint256>_> *)&locator);
  this_02 = pCVar19;
  CBlockIndex::GetBlockHash((uint256 *)&locator,pCVar19);
  pWVar12 = &reserver;
  pvVar11 = (iterator)0x0;
  CWallet::ScanForWalletTransactions
            (&result,(CWallet *)&criticalblock13,(uint256 *)&locator,pCVar19->nHeight,
             (optional<int>)0x0,pWVar12,false,true);
  local_910 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_908 = "";
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)pWVar12;
  msg_06.m_begin = pvVar11;
  file_06.m_end = (iterator)0x7e;
  file_06.m_begin = (iterator)&local_910;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_920,
             msg_06);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_930 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_928 = "";
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  pvVar11 = (iterator)0x2;
  pSVar13 = &result;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::CWallet::ScanResult::_unnamed_type_1_,_unnamed_type_1_>
            (&locator,&local_930,0x7e,1,2,pSVar13,0xc83506,(int)ar,"CWallet::ScanResult::SUCCESS");
  local_940 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_938 = "";
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)pSVar13;
  msg_07.m_begin = pvVar11;
  file_07.m_end = (iterator)0x7f;
  file_07.m_begin = (iterator)&local_940;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_950,
             msg_07);
  bVar4 = base_blob<256U>::IsNull(&result.last_failed_block.super_base_blob<256U>);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a28._0_8_ = "result.last_failed_block.IsNull()";
  local_a28.m_message.px = (element_type *)0xc83552;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_960 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_958 = "";
  pvVar11 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,(check_type)ar,
             (size_t)&local_960,0x7f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_970 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_968 = "";
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar14;
  msg_08.m_begin = pvVar11;
  file_08.m_end = (iterator)0x80;
  file_08.m_begin = (iterator)&local_970;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_980,
             msg_08);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_990 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_988 = "";
  puVar15 = &result.last_scanned_block;
  CBlockIndex::GetBlockHash((uint256 *)&locator_1,this_01);
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&locator,&local_990,0x80,1,2,puVar15,0xc835ef,(int)(assertion_result *)&locator_1,
             "newTip->GetBlockHash()");
  local_9a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_998 = "";
  local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)puVar15;
  msg_09.m_begin = pvVar11;
  file_09.m_end = (iterator)0x81;
  file_09.m_begin = (iterator)&local_9a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_9b0,
             msg_09);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_9c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_9b8 = "";
  poVar16 = &result.last_scanned_height;
  uVar20 = SUB84(&this_01->nHeight,0);
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&locator,&local_9c0,0x81,1,2,poVar16,0xc83620,uVar20,"newTip->nHeight");
  local_9d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_9c8 = "";
  local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)poVar16;
  msg_10.m_begin = pvVar11;
  file_10.m_end = (iterator)0x82;
  file_10.m_begin = (iterator)&local_9d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_9e0,
             msg_10);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_9f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_9e8 = "";
  GetBalance((Balance *)&locator,(CWallet *)&criticalblock13,0,true);
  ppuVar17 = &locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_a28._0_8_ =
       (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)
       0x2540be400;
  pcVar25 = "100 * COIN";
  pplVar24 = (long **)&local_a28;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&locator_1,&local_9f0,0x82,1,2,ppuVar17,0xc83592);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_9f8 = "";
  local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = (iterator)ppuVar17;
  msg_11.m_begin = pvVar11;
  file_11.m_end = (iterator)0x86;
  file_11.m_begin = (iterator)&local_a00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_a10,
             msg_11);
  pWVar9 = CWallet::GetDatabase((CWallet *)&criticalblock13);
  (*pWVar9->_vptr_WalletDatabase[0xe])(&local_8c0,pWVar9,1);
  local_8c0.m_database = pWVar9;
  bVar4 = WalletBatch::ReadBestBlock(&local_8c0,&locator_1);
  local_a28.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar4;
  local_a28.m_message.px = (element_type *)0x0;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a38 = "WalletBatch{wallet.GetDatabase()}.ReadBestBlock(locator)";
  local_a30 = "";
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_a48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_a40 = "";
  pvVar11 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a28,(lazy_ostream *)&locator,1,0,WARN,(check_type)pplVar24,(size_t)&local_a48,
             0x86);
  boost::detail::shared_count::~shared_count(&local_a28.m_message.pn);
  if (local_8c0.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (*(*(_func_int ***)
        local_8c0.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  local_a58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_a50 = "";
  local_a68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar14;
  msg_12.m_begin = pvVar11;
  file_12.m_end = (iterator)0x87;
  file_12.m_begin = (iterator)&local_a58;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_a68,
             msg_12);
  local_a28.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start !=
       locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
       super__Vector_impl_data._M_finish);
  local_a28.m_message.px = (element_type *)0x0;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_8c0.m_batch._M_t.
  super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t.
  super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
  super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl =
       (__uniq_ptr_data<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>,_true,_true>
        )(__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)
         0xc83657;
  local_8c0.m_database = (WalletDatabase *)0xc83668;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_a78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_a70 = "";
  uVar21 = 0;
  uVar22 = 0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a28,(lazy_ostream *)&locator,1,0,WARN,(check_type)pplVar24,(size_t)&local_a78,
             0x87);
  boost::detail::shared_count::~shared_count(&local_a28.m_message.pn);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            ((_Vector_base<uint256,_std::allocator<uint256>_> *)&locator_1);
  WalletRescanReserver::~WalletRescanReserver(&reserver);
  CWallet::~CWallet((CWallet *)&criticalblock13);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock13,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x8e,false);
  FVar6 = CBlockIndex::GetBlockPos(this_02);
  puVar10 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      (val,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                       ,0x90,"test_method","m_node.chainman");
  ::node::BlockManager::PruneOneBlockFile
            (&((puVar10->_M_t).
               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
               super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_blockman,
             FVar6.nFile);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  pCVar2 = (val->_M_t).
           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
           super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  result.status = FVar6.nFile;
  __l._M_len = 1;
  __l._M_array = (iterator)&result;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&criticalblock13,__l,
             (less<int> *)&reserver,(allocator_type *)&locator);
  ::node::BlockManager::UnlinkPrunedFiles
            (&pCVar2->m_blockman,(set<int,_std::less<int>,_std::allocator<int>_> *)&criticalblock13)
  ;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &criticalblock13);
  pCVar3 = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"",(allocator<char> *)&reserver);
  local_6c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_6c8._M_impl.super__Rb_tree_header._M_header;
  local_6c8._M_impl._0_8_ = 0;
  local_6c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_6c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_6c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_6c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  records_01._M_t._M_impl._4_4_ = uVar22;
  records_01._M_t._M_impl._0_4_ = uVar21;
  records_01._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (int)pplVar24;
  records_01._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = (int)((ulong)pplVar24 >> 0x20);
  records_01._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pcVar25;
  records_01._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffff360;
  records_01._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)this_01;
  records_01._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this_02;
  local_6c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_6c8._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase(records_01);
  CWallet::CWallet((CWallet *)&criticalblock13,pCVar3,(string *)&result,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_a80);
  if (local_a80 != (long *)0x0) {
    (**(code **)(*local_a80 + 8))();
  }
  local_a80 = (long *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_6c8);
  std::__cxx11::string::~string((string *)&result);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&result,local_368,
             "wallet.cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x99,false);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x9a,"test_method","m_node.chainman");
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&reserver,&cs_main,
             "Assert(m_node.chainman)->GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x9a,false);
  CWallet::SetWalletFlag((CWallet *)&criticalblock13,0x400000000);
  ChainstateManager::ActiveChainstate
            ((val->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar5 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CBlockIndex::GetBlockHash
            (&local_6e8,
             (pCVar5->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&reserver);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&result)
  ;
  AddKey((CWallet *)&criticalblock13,this_00);
  pWVar12 = &reserver;
  reserver._8_8_ = reserver._8_8_ & 0xffffffffffffff00;
  reserver.m_now.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  reserver.m_now.super__Function_base._M_functor._8_8_ = 0;
  reserver.m_now.super__Function_base._M_manager = (_Manager_type)0x0;
  reserver.m_now._M_invoker = (_Invoker_type)0x0;
  reserver.m_wallet = (CWallet *)&criticalblock13;
  WalletRescanReserver::reserve(pWVar12,false);
  pCVar19 = this_02;
  CBlockIndex::GetBlockHash((uint256 *)&locator,this_02);
  pvVar11 = (iterator)0x0;
  CWallet::ScanForWalletTransactions
            (&result,(CWallet *)&criticalblock13,(uint256 *)&locator,this_02->nHeight,
             (optional<int>)0x0,pWVar12,false,false);
  local_a90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_a88 = "";
  local_aa0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = (iterator)pWVar12;
  msg_13.m_begin = pvVar11;
  file_13.m_end = (iterator)0xa2;
  file_13.m_begin = (iterator)&local_a90;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_aa0,
             msg_13);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_ab0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_aa8 = "";
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  uVar21 = SUB84((uint256 *)&locator_1,0);
  pvVar11 = (iterator)0x2;
  pSVar13 = &result;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::CWallet::ScanResult::_unnamed_type_1_,_unnamed_type_1_>
            (&locator,&local_ab0,0xa2,1,2,pSVar13,0xc83506,uVar21,"CWallet::ScanResult::FAILURE");
  local_ac0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_ab8 = "";
  local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ac8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = (iterator)pSVar13;
  msg_14.m_begin = pvVar11;
  file_14.m_end = (iterator)0xa3;
  file_14.m_begin = (iterator)&local_ac0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_ad0,
             msg_14);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_ae0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_ad8 = "";
  puVar15 = &result.last_failed_block;
  CBlockIndex::GetBlockHash((uint256 *)&locator_1,pCVar19);
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&locator,&local_ae0,0xa3,1,2,puVar15,0xc83669,uVar21,"oldTip->GetBlockHash()");
  local_af0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_ae8 = "";
  local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = (iterator)puVar15;
  msg_15.m_begin = pvVar11;
  file_15.m_end = (iterator)0xa4;
  file_15.m_begin = (iterator)&local_af0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_b00,
             msg_15);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_b10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_b08 = "";
  puVar15 = &result.last_scanned_block;
  CBlockIndex::GetBlockHash((uint256 *)&locator_1,this_01);
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&locator,&local_b10,0xa4,1,2,puVar15,0xc835ef,uVar21,"newTip->GetBlockHash()");
  local_b20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_b18 = "";
  local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b28 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = (iterator)puVar15;
  msg_16.m_begin = pvVar11;
  file_16.m_end = (iterator)0xa5;
  file_16.m_begin = (iterator)&local_b20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_b30,
             msg_16);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_b40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_b38 = "";
  poVar16 = &result.last_scanned_height;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&locator,&local_b40,0xa5,1,2,poVar16,0xc83620,uVar20,"newTip->nHeight");
  local_b50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_b48 = "";
  local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = (iterator)poVar16;
  msg_17.m_begin = pvVar11;
  file_17.m_end = (iterator)0xa6;
  file_17.m_begin = (iterator)&local_b50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_b60,
             msg_17);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_b70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_b68 = "";
  GetBalance((Balance *)&locator,(CWallet *)&criticalblock13,0,true);
  local_a28._0_8_ =
       (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)
       0x12a05f200;
  pcVar25 = "50 * COIN";
  pplVar24 = (long **)&local_a28;
  uVar20 = 0xc83592;
  uVar21 = 0;
  puVar15 = (uint256 *)&locator_1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (puVar15,&local_b70,0xa6,1,2);
  WalletRescanReserver::~WalletRescanReserver(&reserver);
  CWallet::~CWallet((CWallet *)&criticalblock13);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock13,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xab,false);
  FVar6 = CBlockIndex::GetBlockPos(this_01);
  puVar10 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      (val,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                       ,0xad,"test_method","m_node.chainman");
  ::node::BlockManager::PruneOneBlockFile
            (&((puVar10->_M_t).
               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
               super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_blockman,
             FVar6.nFile);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  pCVar2 = (val->_M_t).
           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
           super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  result.status = FVar6.nFile;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&result;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&criticalblock13,__l_00,
             (less<int> *)&reserver,(allocator_type *)&locator);
  ::node::BlockManager::UnlinkPrunedFiles
            (&pCVar2->m_blockman,(set<int,_std::less<int>,_std::allocator<int>_> *)&criticalblock13)
  ;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &criticalblock13);
  pCVar3 = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"",(allocator<char> *)&reserver);
  local_718._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_718._M_impl.super__Rb_tree_header._M_header;
  local_718._M_impl._0_8_ = 0;
  local_718._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_718._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_718._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_718._M_impl.super__Rb_tree_header._M_node_count = 0;
  records_02._M_t._M_impl._4_4_ = uVar21;
  records_02._M_t._M_impl._0_4_ = uVar20;
  records_02._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (int)pplVar24;
  records_02._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = (int)((ulong)pplVar24 >> 0x20);
  records_02._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pcVar25;
  records_02._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffff360;
  records_02._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)this_01;
  records_02._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pCVar19;
  local_718._M_impl.super__Rb_tree_header._M_header._M_right =
       local_718._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase(records_02);
  CWallet::CWallet((CWallet *)&criticalblock13,pCVar3,(string *)&result,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_b78);
  if (local_b78 != (long *)0x0) {
    (**(code **)(*local_b78 + 8))();
  }
  local_b78 = (long *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_718);
  std::__cxx11::string::~string((string *)&result);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&result,local_368,
             "wallet.cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xb5,false);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xb6,"test_method","m_node.chainman");
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&reserver,&cs_main,
             "Assert(m_node.chainman)->GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xb6,false);
  CWallet::SetWalletFlag((CWallet *)&criticalblock13,0x400000000);
  ChainstateManager::ActiveChainstate
            ((val->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar5 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CBlockIndex::GetBlockHash
            (&local_738,
             (pCVar5->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&reserver);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&result)
  ;
  AddKey((CWallet *)&criticalblock13,this_00);
  pWVar12 = &reserver;
  reserver._8_8_ = reserver._8_8_ & 0xffffffffffffff00;
  reserver.m_now.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  reserver.m_now.super__Function_base._M_functor._8_8_ = 0;
  reserver.m_now.super__Function_base._M_manager = (_Manager_type)0x0;
  reserver.m_now._M_invoker = (_Invoker_type)0x0;
  reserver.m_wallet = (CWallet *)&criticalblock13;
  WalletRescanReserver::reserve(pWVar12,false);
  CBlockIndex::GetBlockHash((uint256 *)&locator,pCVar19);
  pvVar11 = (iterator)0x0;
  CWallet::ScanForWalletTransactions
            (&result,(CWallet *)&criticalblock13,(uint256 *)&locator,pCVar19->nHeight,
             (optional<int>)0x0,pWVar12,false,false);
  local_b88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_b80 = "";
  local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = (iterator)pWVar12;
  msg_18.m_begin = pvVar11;
  file_18.m_end = (iterator)0xbe;
  file_18.m_begin = (iterator)&local_b88;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_b98,
             msg_18);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_ba8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_ba0 = "";
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar11 = (iterator)0x2;
  pSVar13 = &result;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::CWallet::ScanResult::_unnamed_type_1_,_unnamed_type_1_>
            (&locator,&local_ba8,0xbe,1,2,pSVar13,0xc83506,(int)puVar15,
             "CWallet::ScanResult::FAILURE");
  local_bb8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_bb0 = "";
  local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = (iterator)pSVar13;
  msg_19.m_begin = pvVar11;
  file_19.m_end = (iterator)0xbf;
  file_19.m_begin = (iterator)&local_bb8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_bc8,
             msg_19);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_bd8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_bd0 = "";
  puVar18 = &result.last_failed_block;
  CBlockIndex::GetBlockHash(puVar15,this_01);
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&locator,&local_bd8,0xbf,1,2,puVar18,0xc83669,(int)puVar15,"newTip->GetBlockHash()");
  local_be8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_be0 = "";
  local_bf8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = (iterator)puVar18;
  msg_20.m_begin = pvVar11;
  file_20.m_end = (iterator)0xc0;
  file_20.m_begin = (iterator)&local_be8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_bf8,
             msg_20);
  bVar4 = base_blob<256U>::IsNull(&result.last_scanned_block.super_base_blob<256U>);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a28._0_8_ = "result.last_scanned_block.IsNull()";
  local_a28.m_message.px = (element_type *)0xc83575;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_c08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_c00 = "";
  pvVar11 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,(check_type)puVar15,
             (size_t)&local_c08,0xc0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_c18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_c10 = "";
  local_c28 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = pvVar14;
  msg_21.m_begin = pvVar11;
  file_21.m_end = (iterator)0xc1;
  file_21.m_begin = (iterator)&local_c18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_c28,
             msg_21);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(CONCAT71(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start._1_7_,
                          result.last_scanned_height.super__Optional_base<int,_true,_true>.
                          _M_payload.super__Optional_payload_base<int>._M_engaged) ^ 1);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a28._0_8_ = "!result.last_scanned_height";
  local_a28.m_message.px = (element_type *)0xc83591;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_c38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_c30 = "";
  pvVar11 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,(check_type)puVar15,
             (size_t)&local_c38,0xc1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_c48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_c40 = "";
  local_c58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pvVar14;
  msg_22.m_begin = pvVar11;
  file_22.m_end = (iterator)0xc2;
  file_22.m_begin = (iterator)&local_c48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_c58,
             msg_22);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_c68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_c60 = "";
  GetBalance((Balance *)&locator,(CWallet *)&criticalblock13,0,true);
  local_a28._0_8_ = local_a28._0_8_ & 0xffffffff00000000;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&locator_1,&local_c68,0xc2,1,2,
             &locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0xc83592,(int)&local_a28,"0");
  WalletRescanReserver::~WalletRescanReserver(&reserver);
  CWallet::~CWallet((CWallet *)&criticalblock13);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(scan_for_wallet_transactions, TestChain100Setup)
{
    // Cap last block file size, and mine new block in a new block file.
    CBlockIndex* oldTip = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip());
    WITH_LOCK(::cs_main, m_node.chainman->m_blockman.GetBlockFileInfo(oldTip->GetBlockPos().nFile)->nSize = MAX_BLOCKFILE_SIZE);
    CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
    CBlockIndex* newTip = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip());

    // Verify ScanForWalletTransactions fails to read an unknown start block.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        reserver.reserve();
        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/{}, /*start_height=*/0, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/false);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::FAILURE);
        BOOST_CHECK(result.last_failed_block.IsNull());
        BOOST_CHECK(result.last_scanned_block.IsNull());
        BOOST_CHECK(!result.last_scanned_height);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 0);
    }

    // Verify ScanForWalletTransactions picks up transactions in both the old
    // and new block files.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        std::chrono::steady_clock::time_point fake_time;
        reserver.setNow([&] { fake_time += 60s; return fake_time; });
        reserver.reserve();

        {
            CBlockLocator locator;
            BOOST_CHECK(!WalletBatch{wallet.GetDatabase()}.ReadBestBlock(locator));
            BOOST_CHECK(locator.IsNull());
        }

        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/oldTip->GetBlockHash(), /*start_height=*/oldTip->nHeight, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/true);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::SUCCESS);
        BOOST_CHECK(result.last_failed_block.IsNull());
        BOOST_CHECK_EQUAL(result.last_scanned_block, newTip->GetBlockHash());
        BOOST_CHECK_EQUAL(*result.last_scanned_height, newTip->nHeight);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 100 * COIN);

        {
            CBlockLocator locator;
            BOOST_CHECK(WalletBatch{wallet.GetDatabase()}.ReadBestBlock(locator));
            BOOST_CHECK(!locator.IsNull());
        }
    }

    // Prune the older block file.
    int file_number;
    {
        LOCK(cs_main);
        file_number = oldTip->GetBlockPos().nFile;
        Assert(m_node.chainman)->m_blockman.PruneOneBlockFile(file_number);
    }
    m_node.chainman->m_blockman.UnlinkPrunedFiles({file_number});

    // Verify ScanForWalletTransactions only picks transactions in the new block
    // file.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        reserver.reserve();
        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/oldTip->GetBlockHash(), /*start_height=*/oldTip->nHeight, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/false);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::FAILURE);
        BOOST_CHECK_EQUAL(result.last_failed_block, oldTip->GetBlockHash());
        BOOST_CHECK_EQUAL(result.last_scanned_block, newTip->GetBlockHash());
        BOOST_CHECK_EQUAL(*result.last_scanned_height, newTip->nHeight);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 50 * COIN);
    }

    // Prune the remaining block file.
    {
        LOCK(cs_main);
        file_number = newTip->GetBlockPos().nFile;
        Assert(m_node.chainman)->m_blockman.PruneOneBlockFile(file_number);
    }
    m_node.chainman->m_blockman.UnlinkPrunedFiles({file_number});

    // Verify ScanForWalletTransactions scans no blocks.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        reserver.reserve();
        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/oldTip->GetBlockHash(), /*start_height=*/oldTip->nHeight, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/false);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::FAILURE);
        BOOST_CHECK_EQUAL(result.last_failed_block, newTip->GetBlockHash());
        BOOST_CHECK(result.last_scanned_block.IsNull());
        BOOST_CHECK(!result.last_scanned_height);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 0);
    }
}